

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageFormatCase::ImageFormatCase
          (ImageFormatCase *this,EglTestContext *eglTestCtx,TestSpec *spec)

{
  char *name;
  char *description;
  TestContext *this_00;
  TestLog *log;
  TextureFormat local_34 [2];
  TestSpec *local_20;
  TestSpec *spec_local;
  EglTestContext *eglTestCtx_local;
  ImageFormatCase *this_local;
  
  local_20 = spec;
  spec_local = (TestSpec *)eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  name = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  egl::TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageFormatCase_0326e9b0;
  this_00 = EglTestContext::getTestContext((EglTestContext *)spec_local);
  log = tcu::TestContext::getLog(this_00);
  glu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,&this->m_gl,log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageFormatCase_0326e9b0;
  TestSpec::TestSpec(&this->m_spec,local_20);
  std::vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>::vector
            (&this->m_apiContexts);
  this->m_display = (EGLDisplay)0x0;
  this->m_window = (NativeWindow *)0x0;
  this->m_surface = (EGLSurface)0x0;
  this->m_config = (EGLConfig)0x0;
  this->m_curIter = 0;
  de::details::MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::MovePtr
            (&this->m_img);
  tcu::TextureFormat::TextureFormat(local_34,RGBA,UNORM_INT8);
  tcu::Texture2D::Texture2D(&this->m_refImg,local_34,1,1);
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

ImageFormatCase::ImageFormatCase (EglTestContext& eglTestCtx, const TestSpec& spec)
	: TestCase				(eglTestCtx, spec.name.c_str(), spec.desc.c_str())
	, glu::CallLogWrapper	(m_gl, eglTestCtx.getTestContext().getLog())
	, m_spec				(spec)
	, m_display				(EGL_NO_DISPLAY)
	, m_window				(DE_NULL)
	, m_surface				(EGL_NO_SURFACE)
	, m_config				(0)
	, m_curIter				(0)
	, m_refImg				(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1)
{
}